

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O1

int cuddLinearInPlace(DdManager *table,int x,int y)

{
  DdHalfWord *pDVar1;
  int *piVar2;
  ulong *puVar3;
  int x_00;
  DdHalfWord y_00;
  uint uVar4;
  uint uVar5;
  int iVar6;
  DdHalfWord DVar7;
  DdHalfWord DVar8;
  DdSubtable *pDVar9;
  DdNode **ppDVar10;
  DdManager *pDVar11;
  long *plVar12;
  DdNode *pDVar13;
  DdNode **ppDVar14;
  int iVar15;
  DdNode *pDVar16;
  DdNode *pDVar17;
  DdNode **ppDVar18;
  byte bVar19;
  DdNode *pDVar20;
  DdNode *pDVar21;
  DdNode **ppDVar22;
  ulong uVar23;
  DdNode *pDVar24;
  DdManager *pDVar25;
  uint uVar26;
  DdManager *pDVar27;
  DdNode *pDVar28;
  DdNode *pDVar29;
  DdManager *pDVar30;
  DdNode *pDVar31;
  bool bVar32;
  
  x_00 = table->invperm[x];
  y_00 = table->invperm[y];
  iVar15 = cuddTestInteract(table,x_00,y_00);
  if (iVar15 != 0) {
    pDVar9 = table->subtables;
    ppDVar22 = pDVar9[x].nodelist;
    uVar26 = pDVar9[x].slots;
    iVar15 = pDVar9[x].shift;
    ppDVar10 = pDVar9[y].nodelist;
    uVar4 = pDVar9[y].keys;
    uVar5 = pDVar9[y].slots;
    iVar6 = pDVar9[y].shift;
    DVar7 = table->vars[x_00]->ref;
    DVar8 = table->vars[(int)y_00]->ref;
    uVar23 = 0;
    pDVar25 = (DdManager *)0x0;
    pDVar30 = (DdManager *)0x0;
    do {
      pDVar11 = (DdManager *)ppDVar22[uVar23];
      pDVar27 = pDVar30;
      if (pDVar11 != table) {
        ppDVar22[uVar23] = &table->sentinel;
        pDVar27 = pDVar11;
        if (pDVar30 != (DdManager *)0x0) {
          (pDVar25->sentinel).next = (DdNode *)pDVar11;
          pDVar27 = pDVar30;
        }
        do {
          pDVar25 = pDVar11;
          pDVar11 = (DdManager *)(pDVar25->sentinel).next;
        } while (pDVar11 != table);
      }
      uVar23 = uVar23 + 1;
      pDVar30 = pDVar27;
    } while (uVar23 != uVar26);
    (pDVar25->sentinel).next = (DdNode *)0x0;
    uVar26 = uVar4;
    while (pDVar27 != (DdManager *)0x0) {
      pDVar16 = (pDVar27->sentinel).type.kids.T;
      pDVar20 = pDVar16;
      pDVar17 = pDVar16;
      if (pDVar16->index == y_00) {
        pDVar17 = (pDVar16->type).kids.T;
        pDVar20 = (pDVar16->type).kids.E;
      }
      pDVar31 = (pDVar27->sentinel).type.kids.E;
      pDVar29 = (DdNode *)((ulong)pDVar31 & 0xfffffffffffffffe);
      pDVar21 = pDVar29;
      pDVar24 = pDVar29;
      if (pDVar29->index == y_00) {
        pDVar21 = (pDVar29->type).kids.T;
        pDVar24 = (pDVar29->type).kids.E;
      }
      pDVar30 = (DdManager *)(pDVar27->sentinel).next;
      pDVar28 = (DdNode *)((ulong)pDVar24 ^ 1);
      pDVar13 = (DdNode *)((ulong)pDVar21 ^ 1);
      if (((ulong)pDVar31 & 1) == 0) {
        pDVar28 = pDVar24;
        pDVar13 = pDVar21;
      }
      pDVar16->ref = pDVar16->ref - 1;
      bVar19 = (byte)iVar6;
      pDVar16 = pDVar17;
      pDVar31 = pDVar17;
      if (pDVar17 != pDVar28) {
        ppDVar14 = ppDVar10 +
                   (int)((((uint)pDVar28 & 1) +
                          (int)((DdNode *)((ulong)pDVar28 & 0xfffffffffffffffe))->Id * 2 +
                         (((uint)pDVar17 & 1) +
                         *(int *)(((ulong)pDVar17 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                         0x40f1f9 >> (bVar19 & 0x1f));
        do {
          ppDVar18 = ppDVar14;
          pDVar16 = *ppDVar18;
          ppDVar14 = &pDVar16->next;
        } while (pDVar17 < (pDVar16->type).kids.T);
        bVar32 = pDVar17 == (pDVar16->type).kids.T;
        if (bVar32) {
          if (pDVar28 < (pDVar16->type).kids.E) {
            do {
              pDVar31 = pDVar16;
              pDVar16 = pDVar31->next;
              bVar32 = pDVar17 == (pDVar16->type).kids.T;
              if (!bVar32) {
                ppDVar18 = &pDVar31->next;
                goto LAB_009148cf;
              }
            } while (pDVar28 < (pDVar16->type).kids.E);
            ppDVar18 = &pDVar31->next;
          }
          if ((bVar32) && (pDVar31 = pDVar16, (pDVar16->type).kids.E == pDVar28)) goto LAB_00914940;
        }
LAB_009148cf:
        pDVar16 = cuddDynamicAllocNode(table);
        if (pDVar16 == (DdNode *)0x0) goto LAB_00914ca6;
        pDVar16->index = y_00;
        pDVar16->ref = 1;
        (pDVar16->type).kids.T = pDVar17;
        (pDVar16->type).kids.E = pDVar28;
        uVar26 = uVar26 + 1;
        pDVar16->next = *ppDVar18;
        *ppDVar18 = pDVar16;
        pDVar17->ref = pDVar17->ref + 1;
        pDVar31 = (DdNode *)((ulong)pDVar28 & 0xfffffffffffffffe);
      }
LAB_00914940:
      pDVar31->ref = pDVar31->ref + 1;
      (pDVar27->sentinel).type.kids.T = pDVar16;
      pDVar29->ref = pDVar29->ref - 1;
      if (pDVar13 == pDVar20) {
        piVar2 = (int *)(((ulong)pDVar13 & 0xfffffffffffffffe) + 4);
        *piVar2 = *piVar2 + 1;
        pDVar17 = pDVar13;
      }
      else {
        pDVar21 = (DdNode *)((ulong)pDVar20 ^ 1);
        pDVar31 = (DdNode *)((ulong)pDVar13 & 0xfffffffffffffffe);
        if (((ulong)pDVar13 & 1) == 0) {
          pDVar21 = pDVar20;
          pDVar31 = pDVar13;
        }
        ppDVar14 = ppDVar10 +
                   (int)((((uint)pDVar21 & 1) +
                          (int)((DdNode *)((ulong)pDVar21 & 0xfffffffffffffffe))->Id * 2 +
                         (((uint)pDVar31 & 1) +
                         *(int *)(((ulong)pDVar31 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                         0x40f1f9 >> (bVar19 & 0x1f));
        do {
          ppDVar18 = ppDVar14;
          pDVar17 = *ppDVar18;
          ppDVar14 = &pDVar17->next;
        } while (pDVar31 < (pDVar17->type).kids.T);
        bVar32 = pDVar31 == (pDVar17->type).kids.T;
        if (bVar32) {
          if (pDVar21 < (pDVar17->type).kids.E) {
            do {
              pDVar20 = pDVar17;
              pDVar17 = pDVar20->next;
              bVar32 = pDVar31 == (pDVar17->type).kids.T;
              if (!bVar32) {
                ppDVar18 = &pDVar20->next;
                goto LAB_009149cc;
              }
            } while (pDVar21 < (pDVar17->type).kids.E);
            ppDVar18 = &pDVar20->next;
          }
          if ((!bVar32) || (pDVar20 = pDVar17, (pDVar17->type).kids.E != pDVar21))
          goto LAB_009149cc;
        }
        else {
LAB_009149cc:
          pDVar17 = cuddDynamicAllocNode(table);
          if (pDVar17 == (DdNode *)0x0) {
LAB_00914ca6:
            fwrite("Error: cuddLinearInPlace out of memory\n",0x27,1,(FILE *)table->err);
            return 0;
          }
          pDVar17->index = y_00;
          pDVar17->ref = 1;
          (pDVar17->type).kids.T = pDVar31;
          (pDVar17->type).kids.E = pDVar21;
          uVar26 = uVar26 + 1;
          pDVar17->next = *ppDVar18;
          *ppDVar18 = pDVar17;
          pDVar31->ref = pDVar31->ref + 1;
          pDVar20 = (DdNode *)((ulong)pDVar21 & 0xfffffffffffffffe);
        }
        pDVar20->ref = pDVar20->ref + 1;
        if (((ulong)pDVar13 & 1) != 0) {
          pDVar17 = (DdNode *)((ulong)pDVar17 ^ 1);
        }
      }
      (pDVar27->sentinel).type.kids.E = pDVar17;
      ppDVar14 = ppDVar22 +
                 (int)((((uint)pDVar17 & 1) +
                        *(int *)(((ulong)pDVar17 & 0xfffffffffffffffe) + 0x20) * 2 +
                       (((uint)pDVar16 & 1) +
                       *(int *)(((ulong)pDVar16 & 0xfffffffffffffffe) + 0x20) * 2) * 0xc00005) *
                       0x40f1f9 >> ((byte)iVar15 & 0x1f));
      do {
        ppDVar18 = ppDVar14;
        pDVar20 = *ppDVar18;
        ppDVar14 = &pDVar20->next;
      } while (pDVar16 < (pDVar20->type).kids.T);
      if ((pDVar16 == (pDVar20->type).kids.T) && (pDVar17 < (pDVar20->type).kids.E)) {
        do {
          pDVar31 = pDVar20;
          pDVar20 = pDVar31->next;
          if (pDVar16 != (pDVar20->type).kids.T) break;
        } while (pDVar17 < (pDVar20->type).kids.E);
        ppDVar18 = &pDVar31->next;
      }
      (pDVar27->sentinel).next = *ppDVar18;
      *ppDVar18 = &pDVar27->sentinel;
      pDVar27 = pDVar30;
    }
    if (0 < (int)uVar5) {
      uVar23 = 0;
      do {
        ppDVar22 = ppDVar10 + uVar23;
        pDVar30 = (DdManager *)*ppDVar22;
        while (pDVar30 != table) {
          pDVar25 = (DdManager *)(pDVar30->sentinel).next;
          if ((pDVar30->sentinel).ref == 0) {
            pDVar1 = &((pDVar30->sentinel).type.kids.T)->ref;
            *pDVar1 = *pDVar1 - 1;
            piVar2 = (int *)(((ulong)(pDVar30->sentinel).type.kids.E & 0xfffffffffffffffe) + 4);
            *piVar2 = *piVar2 + -1;
            (pDVar30->sentinel).next = table->nextFree;
            table->nextFree = &pDVar30->sentinel;
            uVar26 = uVar26 - 1;
            pDVar30 = pDVar25;
          }
          else {
            *ppDVar22 = &pDVar30->sentinel;
            ppDVar22 = &(pDVar30->sentinel).next;
            pDVar30 = pDVar25;
          }
        }
        *ppDVar22 = &table->sentinel;
        uVar23 = uVar23 + 1;
      } while (uVar23 != uVar5);
    }
    table->isolated =
         (-(uint)(DVar8 == 1) - (uint)(DVar7 == 1)) + (uint)(table->vars[x_00]->ref == 1) +
         table->isolated + (uint)(table->vars[(int)y_00]->ref == 1);
    table->subtables[y].keys = uVar26;
    table->keys = table->keys + (uVar26 - uVar4);
    iVar15 = table->size + -1 >> 6;
    if (-1 < iVar15) {
      plVar12 = table->linear;
      uVar26 = iVar15 + 1;
      uVar23 = 0;
      do {
        puVar3 = (ulong *)(plVar12 + (long)(int)(x_00 * uVar26) + uVar23);
        *puVar3 = *puVar3 ^ plVar12[(long)(int)(y_00 * uVar26) + uVar23];
        uVar23 = uVar23 + 1;
      } while (uVar26 != uVar23);
    }
  }
  return table->keys - table->isolated;
}

Assistant:

int
cuddLinearInPlace(
  DdManager * table,
  int  x,
  int  y)
{
    DdNodePtr *xlist, *ylist;
    int    xindex, yindex;
    int    xslots, yslots;
    int    xshift, yshift;
    int    oldxkeys, oldykeys;
    int    newxkeys, newykeys;
    int    comple, newcomplement;
    int    i;
    int    posn;
    int    isolated;
    DdNode *f,*f0,*f1,*f01,*f00,*f11,*f10,*newf1,*newf0;
    DdNode *g,*next,*last=NULL;
    DdNodePtr *previousP;
    DdNode *tmp;
    DdNode *sentinel = &(table->sentinel);
#ifdef DD_DEBUG
    int    count, idcheck;
#endif

#ifdef DD_DEBUG
    assert(x < y);
    assert(cuddNextHigh(table,x) == y);
    assert(table->subtables[x].keys != 0);
    assert(table->subtables[y].keys != 0);
    assert(table->subtables[x].dead == 0);
    assert(table->subtables[y].dead == 0);
#endif

    xindex = table->invperm[x];
    yindex = table->invperm[y];

    if (cuddTestInteract(table,xindex,yindex)) {
#ifdef DD_STATS
        ddTotalNumberLinearTr++;
#endif
        /* Get parameters of x subtable. */
        xlist = table->subtables[x].nodelist;
        oldxkeys = table->subtables[x].keys;
        xslots = table->subtables[x].slots;
        xshift = table->subtables[x].shift;

        /* Get parameters of y subtable. */
        ylist = table->subtables[y].nodelist;
        oldykeys = table->subtables[y].keys;
        yslots = table->subtables[y].slots;
        yshift = table->subtables[y].shift;

        newxkeys = 0;
        newykeys = oldykeys;

        /* Check whether the two projection functions involved in this
        ** swap are isolated. At the end, we'll be able to tell how many
        ** isolated projection functions are there by checking only these
        ** two functions again. This is done to eliminate the isolated
        ** projection functions from the node count.
        */
        isolated = - ((table->vars[xindex]->ref == 1) +
                     (table->vars[yindex]->ref == 1));

        /* The nodes in the x layer are put in a chain.
        ** The chain is handled as a FIFO; g points to the beginning and
        ** last points to the end.
        */
        g = NULL;
#ifdef DD_DEBUG
        last = NULL;
#endif
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            if (f == sentinel) continue;
            xlist[i] = sentinel;
            if (g == NULL) {
                g = f;
            } else {
                last->next = f;
            }
            while ((next = f->next) != sentinel) {
                f = next;
            } /* while there are elements in the collision chain */
            last = f;
        } /* for each slot of the x subtable */
#ifdef DD_DEBUG
        /* last is always assigned in the for loop because there is at
        ** least one key */
        assert(last != NULL);
#endif
        last->next = NULL;

#ifdef DD_COUNT
        table->swapSteps += oldxkeys;
#endif
        /* Take care of the x nodes that must be re-expressed.
        ** They form a linked list pointed by g.
        */
        f = g;
        while (f != NULL) {
            next = f->next;
            /* Find f1, f0, f11, f10, f01, f00. */
            f1 = cuddT(f);
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f1)));
#endif
            if ((int) f1->index == yindex) {
                f11 = cuddT(f1); f10 = cuddE(f1);
            } else {
                f11 = f10 = f1;
            }
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(f11)));
#endif
            f0 = cuddE(f);
            comple = Cudd_IsComplement(f0);
            f0 = Cudd_Regular(f0);
            if ((int) f0->index == yindex) {
                f01 = cuddT(f0); f00 = cuddE(f0);
            } else {
                f01 = f00 = f0;
            }
            if (comple) {
                f01 = Cudd_Not(f01);
                f00 = Cudd_Not(f00);
            }
            /* Decrease ref count of f1. */
            cuddSatDec(f1->ref);
            /* Create the new T child. */
            if (f11 == f00) {
                newf1 = f11;
                cuddSatInc(newf1->ref);
            } else {
                /* Check ylist for triple (yindex,f11,f00). */
                posn = ddHash(cuddF2L(f11), cuddF2L(f00), yshift);
                /* For each element newf1 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf1 = *previousP;
                while (f11 < cuddT(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                while (f11 == cuddT(newf1) && f00 < cuddE(newf1)) {
                    previousP = &(newf1->next);
                    newf1 = *previousP;
                }
                if (cuddT(newf1) == f11 && cuddE(newf1) == f00) {
                    cuddSatInc(newf1->ref);
                } else { /* no match */
                    newf1 = cuddDynamicAllocNode(table);
                    if (newf1 == NULL)
                        goto cuddLinearOutOfMem;
                    newf1->index = yindex; newf1->ref = 1;
                    cuddT(newf1) = f11;
                    cuddE(newf1) = f00;
                    /* Insert newf1 in the collision list ylist[posn];
                    ** increase the ref counts of f11 and f00.
                    */
                    newykeys++;
                    newf1->next = *previousP;
                    *previousP = newf1;
                    cuddSatInc(f11->ref);
                    tmp = Cudd_Regular(f00);
                    cuddSatInc(tmp->ref);
                }
            }
            cuddT(f) = newf1;
#ifdef DD_DEBUG
            assert(!(Cudd_IsComplement(newf1)));
#endif

            /* Do the same for f0, keeping complement dots into account. */
            /* decrease ref count of f0 */
            tmp = Cudd_Regular(f0);
            cuddSatDec(tmp->ref);
            /* create the new E child */
            if (f01 == f10) {
                newf0 = f01;
                tmp = Cudd_Regular(newf0);
                cuddSatInc(tmp->ref);
            } else {
                /* make sure f01 is regular */
                newcomplement = Cudd_IsComplement(f01);
                if (newcomplement) {
                    f01 = Cudd_Not(f01);
                    f10 = Cudd_Not(f10);
                }
                /* Check ylist for triple (yindex,f01,f10). */
                posn = ddHash(cuddF2L(f01), cuddF2L(f10), yshift);
                /* For each element newf0 in collision list ylist[posn]. */
                previousP = &(ylist[posn]);
                newf0 = *previousP;
                while (f01 < cuddT(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                while (f01 == cuddT(newf0) && f10 < cuddE(newf0)) {
                    previousP = &(newf0->next);
                    newf0 = *previousP;
                }
                if (cuddT(newf0) == f01 && cuddE(newf0) == f10) {
                    cuddSatInc(newf0->ref);
                } else { /* no match */
                    newf0 = cuddDynamicAllocNode(table);
                    if (newf0 == NULL)
                        goto cuddLinearOutOfMem;
                    newf0->index = yindex; newf0->ref = 1;
                    cuddT(newf0) = f01;
                    cuddE(newf0) = f10;
                    /* Insert newf0 in the collision list ylist[posn];
                    ** increase the ref counts of f01 and f10.
                    */
                    newykeys++;
                    newf0->next = *previousP;
                    *previousP = newf0;
                    cuddSatInc(f01->ref);
                    tmp = Cudd_Regular(f10);
                    cuddSatInc(tmp->ref);
                }
                if (newcomplement) {
                    newf0 = Cudd_Not(newf0);
                }
            }
            cuddE(f) = newf0;

            /* Re-insert the modified f in xlist.
            ** The modified f does not already exists in xlist.
            ** (Because of the uniqueness of the cofactors.)
            */
            posn = ddHash(cuddF2L(newf1), cuddF2L(newf0), xshift);
            newxkeys++;
            previousP = &(xlist[posn]);
            tmp = *previousP;
            while (newf1 < cuddT(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            while (newf1 == cuddT(tmp) && newf0 < cuddE(tmp)) {
                previousP = &(tmp->next);
                tmp = *previousP;
            }
            f->next = *previousP;
            *previousP = f;
            f = next;
        } /* while f != NULL */

        /* GC the y layer. */

        /* For each node f in ylist. */
        for (i = 0; i < yslots; i++) {
            previousP = &(ylist[i]);
            f = *previousP;
            while (f != sentinel) {
                next = f->next;
                if (f->ref == 0) {
                    tmp = cuddT(f);
                    cuddSatDec(tmp->ref);
                    tmp = Cudd_Regular(cuddE(f));
                    cuddSatDec(tmp->ref);
                    cuddDeallocNode(table,f);
                    newykeys--;
                } else {
                    *previousP = f;
                    previousP = &(f->next);
                }
                f = next;
            } /* while f */
            *previousP = sentinel;
        } /* for every collision list */

#ifdef DD_DEBUG
#if 0
        (void) fprintf(table->out,"Linearly combining %d and %d\n",x,y);
#endif
        count = 0;
        idcheck = 0;
        for (i = 0; i < yslots; i++) {
            f = ylist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) yindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newykeys) {
            fprintf(table->err,"Error in finding newykeys\toldykeys = %d\tnewykeys = %d\tactual = %d\n",oldykeys,newykeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of ylist\twrong id's = %d\n",idcheck);
        count = 0;
        idcheck = 0;
        for (i = 0; i < xslots; i++) {
            f = xlist[i];
            while (f != sentinel) {
                count++;
                if (f->index != (DdHalfWord) xindex)
                    idcheck++;
                f = f->next;
            }
        }
        if (count != newxkeys || newxkeys != oldxkeys) {
            fprintf(table->err,"Error in finding newxkeys\toldxkeys = %d \tnewxkeys = %d \tactual = %d\n",oldxkeys,newxkeys,count);
        }
        if (idcheck != 0)
            fprintf(table->err,"Error in id's of xlist\twrong id's = %d\n",idcheck);
#endif

        isolated += (table->vars[xindex]->ref == 1) +
                    (table->vars[yindex]->ref == 1);
        table->isolated += isolated;

        /* Set the appropriate fields in table. */
        table->subtables[y].keys = newykeys;

        /* Here we should update the linear combination table
        ** to record that x <- x EXNOR y. This is done by complementing
        ** the (x,y) entry of the table.
        */

        table->keys += newykeys - oldykeys;

        cuddXorLinear(table,xindex,yindex);
    }

#ifdef DD_DEBUG
    if (zero) {
        (void) Cudd_DebugCheck(table);
    }
#endif

    return(table->keys - table->isolated);

cuddLinearOutOfMem:
    (void) fprintf(table->err,"Error: cuddLinearInPlace out of memory\n");

    return (0);

}